

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError MuxImagePush(WebPMuxImage *wpi,WebPMuxImage **wpi_list)

{
  void *__dest;
  long *in_RSI;
  void *in_RDI;
  WebPMuxImage *cur_wpi;
  WebPMuxImage *new_wpi;
  size_t in_stack_ffffffffffffffe0;
  WebPMuxError local_4;
  
  for (; (*in_RSI != 0 && (*(long *)(*in_RSI + 0x30) != 0)); in_RSI = (long *)(*in_RSI + 0x30)) {
  }
  __dest = WebPSafeMalloc((uint64_t)in_RSI,in_stack_ffffffffffffffe0);
  if (__dest == (void *)0x0) {
    local_4 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    memcpy(__dest,in_RDI,0x38);
    *(undefined8 *)((long)__dest + 0x30) = 0;
    if (*in_RSI == 0) {
      *in_RSI = (long)__dest;
    }
    else {
      *(void **)(*in_RSI + 0x30) = __dest;
    }
    local_4 = WEBP_MUX_OK;
  }
  return local_4;
}

Assistant:

WebPMuxError MuxImagePush(const WebPMuxImage* wpi, WebPMuxImage** wpi_list) {
  WebPMuxImage* new_wpi;

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    if (cur_wpi->next_ == NULL) break;
    wpi_list = &cur_wpi->next_;
  }

  new_wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*new_wpi));
  if (new_wpi == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_wpi = *wpi;
  new_wpi->next_ = NULL;

  if (*wpi_list != NULL) {
    (*wpi_list)->next_ = new_wpi;
  } else {
    *wpi_list = new_wpi;
  }
  return WEBP_MUX_OK;
}